

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.c
# Opt level: O0

_Bool check_descriptor_address_error(char *function,char *descriptor,uint32_t network)

{
  uint uVar1;
  uint32_t flag;
  int ret;
  char *address;
  char *pcStack_20;
  uint32_t network_local;
  char *descriptor_local;
  char *function_local;
  
  _flag = (char *)0x0;
  address._4_4_ = network;
  pcStack_20 = descriptor;
  descriptor_local = function;
  uVar1 = wally_descriptor_to_address
                    (descriptor,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,network,0
                     ,(char **)&flag);
  if (uVar1 == 0xfffffffe) {
    function_local._7_1_ = true;
  }
  else if (uVar1 == 0) {
    printf("wally_descriptor_to_address Fail[Not Error] name[%s]\n",descriptor_local);
    wally_free_string(_flag);
    function_local._7_1_ = false;
  }
  else {
    printf("wally_descriptor_to_address NG[%d]\n",(ulong)uVar1);
    function_local._7_1_ = false;
  }
  return function_local._7_1_;
}

Assistant:

static bool check_descriptor_address_error(const char *function,
                                           const char *descriptor,
                                           const uint32_t network)
{
    char *address = NULL;
    int ret;
    uint32_t flag = 0;

    ret = wally_descriptor_to_address(
        descriptor,
        (const char **)g_miniscript_keyname_list,
        (const char **)g_miniscript_keyvalue_list,
        sizeof(g_miniscript_keyname_list) / sizeof(char *),
        0,
        network,
        flag,
        &address);
    if (ret == WALLY_EINVAL) {
        return true;
    } else if (ret != WALLY_OK) {
        printf("wally_descriptor_to_address NG[%d]\n", ret);
        return false;
    }
    printf("wally_descriptor_to_address Fail[Not Error] name[%s]\n", function);

    wally_free_string(address);
    return false;
}